

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::ConstantAffixModifier::semanticallyEquivalent
          (ConstantAffixModifier *this,Modifier *other)

{
  UBool UVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  if ((((lVar2 != 0) &&
       (UVar1 = UnicodeString::operator==(&this->fPrefix,(UnicodeString *)(lVar2 + 0x10)),
       UVar1 != '\0')) &&
      (UVar1 = UnicodeString::operator==(&this->fSuffix,(UnicodeString *)(lVar2 + 0x50)),
      UVar1 != '\0')) && (this->fField == *(Field *)(lVar2 + 0x90))) {
    return this->fStrong == (bool)*(char *)(lVar2 + 0x94);
  }
  return false;
}

Assistant:

bool ConstantAffixModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const ConstantAffixModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    return fPrefix == _other->fPrefix
        && fSuffix == _other->fSuffix
        && fField == _other->fField
        && fStrong == _other->fStrong;
}